

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CwiseBinaryOp.h
# Opt level: O2

bool __thiscall
Eigen::
DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)1>,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>_>_>
::all(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)1>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>
      *this)

{
  double *pdVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  
  bVar2 = false;
  do {
    if (bVar2) {
      return bVar2;
    }
    lVar3 = *(long *)(this + 8);
    if (*(long *)(this + 8) < 1) {
      lVar3 = 0;
    }
    lVar4 = 0;
    while (lVar3 != lVar4) {
      pdVar1 = (double *)(**(long **)this + lVar4 * 8);
      lVar4 = lVar4 + 1;
      if (*(double *)(this + 0x18) < *pdVar1 || *(double *)(this + 0x18) == *pdVar1) {
        return bVar2;
      }
    }
    bVar2 = true;
  } while( true );
}

Assistant:

const _LhsNested& lhs() const { return m_lhs; }